

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O1

bool is_utf8(char *string)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  
  if (string == (char *)0x0) {
LAB_001369bd:
    bVar3 = false;
  }
  else {
    bVar2 = *string;
    while (bVar3 = bVar2 == 0, !bVar3) {
      lVar4 = 1;
      if ((((((0xd < bVar2) || ((0x2600U >> (bVar2 & 0x1f) & 1) == 0)) &&
            (0x5e < (byte)(bVar2 - 0x20))) &&
           ((0x1d < (byte)(bVar2 + 0x3e) || (lVar4 = 2, -0x41 < string[1])))) &&
          ((bVar2 != 0xe0 || (((string[1] & 0xe0U) != 0xa0 || (lVar4 = 3, -0x41 < string[2])))))) &&
         ((0xb < (byte)(bVar2 + 0x1f) && (bVar2 & 0xfe) != 0xee ||
          ((-0x41 < string[1] || (lVar4 = 3, -0x41 < string[2])))))) {
        if (bVar2 == 0xf0) {
LAB_0013695d:
          if ((((byte)(string[1] + 0x70U) < 0x30) && (string[2] < -0x40)) &&
             (lVar4 = 4, string[3] < -0x40)) goto LAB_001368b9;
        }
        else if (bVar2 == 0xed) {
          if ((string[1] < -0x60) && (lVar4 = 3, string[2] < -0x40)) goto LAB_001368b9;
          if (bVar2 == 0xf0) goto LAB_0013695d;
        }
        if ((((2 < (byte)(bVar2 + 0xf)) || (-0x41 < string[1])) ||
            ((-0x41 < string[2] || (lVar4 = 4, -0x41 < string[3])))) &&
           (((bVar2 != 0xf4 || (-0x71 < string[1])) ||
            ((-0x41 < string[2] || (lVar4 = 4, -0x41 < string[3])))))) goto LAB_001369bd;
      }
LAB_001368b9:
      pbVar1 = (byte *)(string + lVar4);
      string = string + lVar4;
      bVar2 = *pbVar1;
    }
  }
  return bVar3;
}

Assistant:

bool is_utf8(const char * string)
{
	if (!string)
		return 0;

	const unsigned char * bytes = (const unsigned char *)string;
	while (*bytes)
	{
		if ((// ASCII
			// use bytes[0] <= 0x7F to allow ASCII control characters
			bytes[0] == 0x09 ||
			bytes[0] == 0x0A ||
			bytes[0] == 0x0D ||
			(0x20 <= bytes[0] && bytes[0] <= 0x7E)
			)
			) {
			bytes += 1;
			continue;
		}

		if ((// non-overlong 2-byte
			(0xC2 <= bytes[0] && bytes[0] <= 0xDF) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF)
			)
			) {
			bytes += 2;
			continue;
		}

		if ((// excluding overlongs
			bytes[0] == 0xE0 &&
			(0xA0 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			) ||
			(// straight 3-byte
			((0xE1 <= bytes[0] && bytes[0] <= 0xEC) ||
			bytes[0] == 0xEE ||
			bytes[0] == 0xEF) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			) ||
			(// excluding surrogates
			bytes[0] == 0xED &&
			(0x80 <= bytes[1] && bytes[1] <= 0x9F) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			)
			) {
			bytes += 3;
			continue;
		}

		if ((// planes 1-3
			bytes[0] == 0xF0 &&
			(0x90 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			) ||
			(// planes 4-15
			(0xF1 <= bytes[0] && bytes[0] <= 0xF3) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			) ||
			(// plane 16
			bytes[0] == 0xF4 &&
			(0x80 <= bytes[1] && bytes[1] <= 0x8F) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			)
			) {
			bytes += 4;
			continue;
		}
		return 0;
	}
	return 1;
}